

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5RowidFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  int iVar1;
  char *pcVar2;
  i64 iVar3;
  i64 iVar4;
  long val;
  Mem *pMVar5;
  
  if (nArg == 0) {
    pCtx->isError = 1;
    pMVar5 = pCtx->pOut;
    pcVar2 = "should be: fts5_rowid(subject, ....)";
  }
  else {
    pcVar2 = (char *)sqlite3ValueText(*apVal,'\x01');
    if (pcVar2 != (char *)0x0) {
      iVar1 = sqlite3StrICmp(pcVar2,"segment");
      if (iVar1 == 0) {
        if (nArg == 3) {
          iVar3 = sqlite3VdbeIntValue(apVal[1]);
          iVar4 = sqlite3VdbeIntValue(apVal[2]);
          val = (long)(int)iVar4 + (iVar3 << 0x25);
          pMVar5 = pCtx->pOut;
          if ((pMVar5->flags & 0x2400) != 0) {
            vdbeReleaseAndSetInt64(pMVar5,val);
            return;
          }
          (pMVar5->u).i = val;
          pMVar5->flags = 4;
          return;
        }
        pCtx->isError = 1;
        pMVar5 = pCtx->pOut;
        pcVar2 = "should be: fts5_rowid(\'segment\', segid, pgno))";
        goto LAB_001c320e;
      }
    }
    pCtx->isError = 1;
    pMVar5 = pCtx->pOut;
    pcVar2 = "first arg to fts5_rowid() must be \'segment\'";
  }
LAB_001c320e:
  sqlite3VdbeMemSetStr(pMVar5,pcVar2,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void fts5RowidFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args (always 2) */
  sqlite3_value **apVal           /* Function arguments */
){
  const char *zArg;
  if( nArg==0 ){
    sqlite3_result_error(pCtx, "should be: fts5_rowid(subject, ....)", -1);
  }else{
    zArg = (const char*)sqlite3_value_text(apVal[0]);
    if( 0==sqlite3_stricmp(zArg, "segment") ){
      i64 iRowid;
      int segid, pgno;
      if( nArg!=3 ){
        sqlite3_result_error(pCtx, 
            "should be: fts5_rowid('segment', segid, pgno))", -1
        );
      }else{
        segid = sqlite3_value_int(apVal[1]);
        pgno = sqlite3_value_int(apVal[2]);
        iRowid = FTS5_SEGMENT_ROWID(segid, pgno);
        sqlite3_result_int64(pCtx, iRowid);
      }
    }else{
      sqlite3_result_error(pCtx, 
        "first arg to fts5_rowid() must be 'segment'" , -1
      );
    }
  }
}